

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubcommandTest.cpp
# Opt level: O0

void __thiscall
TApp_FallThroughShort_Test::~TApp_FallThroughShort_Test(TApp_FallThroughShort_Test *this)

{
  TApp_FallThroughShort_Test *this_local;
  
  ~TApp_FallThroughShort_Test(this);
  operator_delete(this);
  return;
}

Assistant:

TEST_F(TApp, FallThroughShort) {
    app.fallthrough();
    int val = 1;
    app.add_option("-v", val);

    app.add_subcommand("sub");

    args = {"sub", "-v", "2"};
    // Should not throw
    run();
}